

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

void discover_cursed_equip(obj *otmp)

{
  char *pcVar1;
  
  if (((otmp != (obj *)0x0) && ((*(uint *)&otmp->field_0x4a & 1) != 0)) &&
     (*(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a | 0x40, flags.verbose != '\0')) {
    pcVar1 = "they feel";
    if (((otmp->quan < 2) && (otmp->oartifact != '\x1d')) && ((long)otmp->otyp != 0xed)) {
      if (otmp->oclass == '\x03') {
        if ((objects[otmp->otyp].oc_subtyp != '\x04') &&
           (pcVar1 = "that feels", objects[otmp->otyp].oc_subtyp == '\x03')) {
          pcVar1 = "they feel";
        }
      }
      else {
        pcVar1 = "that feels";
      }
    }
    pline("Oops; %s deathly cold.",pcVar1);
    return;
  }
  return;
}

Assistant:

static void discover_cursed_equip(struct obj *otmp)
{
	if (otmp && otmp->cursed) {
	    otmp->bknown = TRUE;
	    if (flags.verbose) {
		pline("Oops; %s deathly cold.",
		      (is_plural(otmp) || otmp->otyp == LENSES ||
		       is_boots(otmp) || is_gloves(otmp)) ?
		      "they feel" : "that feels");
	    }
	}
}